

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void reallymarkobject(global_State *g,GCObject *o)

{
  long lVar1;
  l_mem lVar2;
  GCObject **pnext;
  Udata *u;
  UpVal *uv;
  GCObject *o_local;
  global_State *g_local;
  
  lVar2 = objsize(o);
  g->GCmarked = g->GCmarked + lVar2;
  switch(o->tt) {
  case '\x04':
  case '\x14':
    o->marked = o->marked & 0xe7 | 0x20;
    break;
  case '\a':
    if (*(short *)&o->field_0xa == 0) {
      lVar1._0_1_ = o[1].tt;
      lVar1._1_1_ = o[1].marked;
      lVar1._2_6_ = *(undefined6 *)&o[1].field_0xa;
      if ((lVar1 != 0) && ((*(byte *)(*(long *)&o[1].tt + 9) & 0x18) != 0)) {
        reallymarkobject(g,*(GCObject **)&o[1].tt);
      }
      o->marked = o->marked & 0xe7 | 0x20;
      return;
    }
  case '\x05':
  case '\x06':
  case '\b':
  case '\n':
  case '&':
    pnext = getgclist(o);
    linkgclist_(o,pnext,&g->gray);
    break;
  case '\t':
    if (o[1].next == (GCObject *)&o[1].tt) {
      o->marked = o->marked & 0xe7 | 0x20;
    }
    else {
      o->marked = o->marked & 199;
    }
    if ((((o[1].next)->tt & 0x40) != 0) && (((o[1].next)->next->marked & 0x18) != 0)) {
      reallymarkobject(g,(o[1].next)->next);
    }
    break;
  default:
  }
  return;
}

Assistant:

static void reallymarkobject (global_State *g, GCObject *o) {
  g->GCmarked += objsize(o);
  switch (o->tt) {
    case LUA_VSHRSTR:
    case LUA_VLNGSTR: {
      set2black(o);  /* nothing to visit */
      break;
    }
    case LUA_VUPVAL: {
      UpVal *uv = gco2upv(o);
      if (upisopen(uv))
        set2gray(uv);  /* open upvalues are kept gray */
      else
        set2black(uv);  /* closed upvalues are visited here */
      markvalue(g, uv->v.p);  /* mark its content */
      break;
    }
    case LUA_VUSERDATA: {
      Udata *u = gco2u(o);
      if (u->nuvalue == 0) {  /* no user values? */
        markobjectN(g, u->metatable);  /* mark its metatable */
        set2black(u);  /* nothing else to mark */
        break;
      }
      /* else... */
    }  /* FALLTHROUGH */
    case LUA_VLCL: case LUA_VCCL: case LUA_VTABLE:
    case LUA_VTHREAD: case LUA_VPROTO: {
      linkobjgclist(o, g->gray);  /* to be visited later */
      break;
    }
    default: lua_assert(0); break;
  }
}